

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O3

HTS_Boolean HTS_dp_match(char *string,char *pattern,size_t pos,size_t max)

{
  char cVar1;
  char cVar2;
  HTS_Boolean HVar3;
  HTS_Boolean HVar4;
  char *pattern_00;
  
  if (max < pos) {
LAB_0010a19f:
    HVar4 = '\0';
  }
  else {
    cVar1 = *string;
    cVar2 = *pattern;
    HVar4 = '\x01';
    if (cVar1 != '\0' || cVar2 != '\0') {
      pattern_00 = pattern + 1;
      do {
        if (cVar2 != '*') {
          if ((cVar1 == cVar2 || cVar2 == '?') &&
             (HVar4 = HTS_dp_match(string + 1,pattern_00,pos + 1,max + 1), HVar4 != '\0')) {
            return '\x01';
          }
          goto LAB_0010a19f;
        }
        HVar3 = HTS_dp_match(string + 1,pattern_00 + -1,pos + 1,max);
        if (HVar3 != '\0') {
          return '\x01';
        }
        cVar2 = *pattern_00;
        pattern_00 = pattern_00 + 1;
      } while (cVar2 != '\0' || cVar1 != '\0');
    }
  }
  return HVar4;
}

Assistant:

static HTS_Boolean HTS_dp_match(const char *string, const char *pattern, size_t pos, size_t max)
{
   if (pos > max)
      return FALSE;
   if (string[0] == '\0' && pattern[0] == '\0')
      return TRUE;
   if (pattern[0] == '*') {
      if (HTS_dp_match(string + 1, pattern, pos + 1, max) == 1)
         return TRUE;
      else
         return HTS_dp_match(string, pattern + 1, pos, max);
   }
   if (string[0] == pattern[0] || pattern[0] == '?') {
      if (HTS_dp_match(string + 1, pattern + 1, pos + 1, max + 1) == 1)
         return TRUE;
   }

   return FALSE;
}